

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O3

void __thiscall OpenMPClause::addLangExpr(OpenMPClause *this,char *expression,int line,int col)

{
  pointer *pppcVar1;
  pointer *ppSVar2;
  pointer ppcVar3;
  iterator __position;
  iterator __position_00;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  SourceLocation local_48;
  char *local_38;
  
  ppcVar3 = (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)__position._M_current - (long)ppcVar3;
  local_38 = expression;
  if (lVar8 != 0) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      iVar5 = strcmp(ppcVar3[uVar6],expression);
      if (iVar5 == 0) {
        return;
      }
      bVar4 = uVar7 < (ulong)(lVar8 >> 3);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  if (__position._M_current ==
      (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->expressions,__position,
               &local_38);
  }
  else {
    *__position._M_current = expression;
    pppcVar1 = &(this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_48.parent_construct = (SourceLocation *)0x0;
  __position_00._M_current =
       (this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_48.line = line;
    local_48.column = col;
    std::vector<SourceLocation,_std::allocator<SourceLocation>_>::_M_realloc_insert<SourceLocation>
              (&this->locations,__position_00,&local_48);
  }
  else {
    (__position_00._M_current)->line = line;
    (__position_00._M_current)->column = col;
    (__position_00._M_current)->parent_construct = (SourceLocation *)0x0;
    ppSVar2 = &(this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar2 = *ppSVar2 + 1;
  }
  return;
}

Assistant:

void OpenMPClause::addLangExpr(const char *expression, int line, int col) {
    // Since the size of expression vector is supposed to be small, brute force is used here.
    for (unsigned int i = 0; i < this->expressions.size(); i++) {
        if (!strcmp(expressions.at(i), expression)) {
            return;
        };
    };
    expressions.push_back(expression);
    locations.push_back(SourceLocation(line, col));
}